

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satUtil.c
# Opt level: O3

void Sat_Solver2WriteDimacs
               (sat_solver2 *p,char *pFileName,lit *assumpBegin,lit *assumpEnd,int incrementVars)

{
  FILE *__stream;
  int **ppiVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  
  if ((long)p->size < 1) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      if (p->levels[lVar6] == 0) {
        iVar5 = iVar5 + (uint)(p->assigns[lVar6] != '\x03');
      }
      lVar6 = lVar6 + 1;
    } while (p->size != lVar6);
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    puts("Sat_SolverWriteDimacs(): Cannot open the ouput file.");
    return;
  }
  fprintf(__stream,"p cnf %d %d\n",(ulong)(uint)p->size,
          (ulong)(((p->Mem).nEntries[1] +
                  (int)((ulong)((long)assumpEnd - (long)assumpBegin) >> 2) + iVar5 +
                  (p->Mem).nEntries[0]) - 1));
  iVar5 = (p->Mem).iPage[0];
  if (-1 < iVar5) {
    ppiVar1 = (p->Mem).pPages;
    lVar6 = 0;
    do {
      piVar2 = ppiVar1[lVar6];
      if (2 < *piVar2) {
        uVar8 = 2;
        do {
          if ((lVar6 != 0) || (uVar8 != 2)) {
            Sat_SolverClauseWriteDimacs((FILE *)__stream,(clause *)(piVar2 + uVar8),incrementVars);
            ppiVar1 = (p->Mem).pPages;
          }
          uVar8 = uVar8 + (((uint)*(clause *)(piVar2 + uVar8) >> 0xb) + 3 & 0xfffffffe);
          piVar2 = ppiVar1[lVar6];
        } while ((int)uVar8 < *piVar2);
        iVar5 = (p->Mem).iPage[0];
      }
      lVar6 = lVar6 + 2;
    } while ((int)lVar6 <= iVar5);
  }
  iVar5 = p->size;
  pcVar7 = " 0";
  if (0 < iVar5) {
    pcVar3 = " 0";
    if (incrementVars == 0) {
      pcVar3 = "";
    }
    lVar6 = 0;
    do {
      if ((p->levels[lVar6] == 0) && (p->assigns[lVar6] != '\x03')) {
        pcVar4 = "-";
        if (p->assigns[lVar6] != '\x01') {
          pcVar4 = "";
        }
        fprintf(__stream,"%s%d%s\n",pcVar4,(ulong)((uint)(0 < incrementVars) + (int)lVar6),pcVar3);
        iVar5 = p->size;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
  }
  if (assumpBegin != assumpEnd && assumpBegin != (lit *)0x0) {
    if (incrementVars == 0) {
      pcVar7 = "";
    }
    do {
      pcVar3 = "-";
      if ((*assumpBegin & 1U) == 0) {
        pcVar3 = "";
      }
      fprintf(__stream,"%s%d%s\n",pcVar3,(ulong)((*assumpBegin >> 1) + (uint)(0 < incrementVars)),
              pcVar7);
      assumpBegin = (lit *)((uint *)assumpBegin + 1);
    } while (assumpBegin != assumpEnd);
  }
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Sat_Solver2WriteDimacs( sat_solver2 * p, char * pFileName, lit* assumpBegin, lit* assumpEnd, int incrementVars )
{
    Sat_Mem_t * pMem = &p->Mem;
    FILE * pFile;
    clause * c;
    int i, k, nUnits;

    // count the number of unit clauses
    nUnits = 0;
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 )
            nUnits++;

    // start the file
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Sat_SolverWriteDimacs(): Cannot open the ouput file.\n" );
        return;
    }
//    fprintf( pFile, "c CNF generated by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "p cnf %d %d\n", p->size, Sat_MemEntryNum(&p->Mem, 0)-1+Sat_MemEntryNum(&p->Mem, 1)+nUnits+(int)(assumpEnd-assumpBegin) );

    // write the original clauses
    Sat_MemForEachClause2( pMem, c, i, k )
        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write the learned clauses
//    Sat_MemForEachLearned( pMem, c, i, k )
//        Sat_SolverClauseWriteDimacs( pFile, c, incrementVars );

    // write zero-level assertions
    for ( i = 0; i < p->size; i++ )
        if ( p->levels[i] == 0 && p->assigns[i] != 3 ) // varX
            fprintf( pFile, "%s%d%s\n",
                     (p->assigns[i] == 1)? "-": "",    // var0
                     i + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");

    // write the assump
    if (assumpBegin) {
        for (; assumpBegin != assumpEnd; assumpBegin++) {
            fprintf( pFile, "%s%d%s\n",
                     lit_sign(*assumpBegin)? "-": "",
                     lit_var(*assumpBegin) + (int)(incrementVars>0),
                     (incrementVars) ? " 0" : "");
        }
    }

    fprintf( pFile, "\n" );
    fclose( pFile );
}